

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_ahead_log.cpp
# Opt level: O3

void __thiscall duckdb::WriteAheadLog::WriteSequenceValue(WriteAheadLog *this,SequenceValue val)

{
  BinarySerializer *this_00;
  SchemaCatalogEntry *pSVar1;
  WriteAheadLogSerializer WStack_5c8;
  
  WriteAheadLogSerializer::WriteAheadLogSerializer(&WStack_5c8,this,SEQUENCE_VALUE);
  pSVar1 = ((val.entry)->super_StandardEntry).schema;
  this_00 = &WStack_5c8.serializer;
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x65,"schema");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x1c])
            (this_00,&(pSVar1->super_InCatalogEntry).super_CatalogEntry.name);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x66,"name");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x1c])
            (this_00,&((val.entry)->super_StandardEntry).super_InCatalogEntry.super_CatalogEntry.
                      name);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x67,"usage_count");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x15])(this_00,val.usage_count);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[2])(this_00,0x68,"counter");
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[0x16])(this_00,val.counter);
  (*WStack_5c8.serializer.super_Serializer._vptr_Serializer[3])(this_00);
  BinarySerializer::OnObjectEnd(this_00);
  ChecksumWriter::Flush(&WStack_5c8.checksum_writer);
  WriteAheadLogSerializer::~WriteAheadLogSerializer(&WStack_5c8);
  return;
}

Assistant:

void WriteAheadLog::WriteSequenceValue(SequenceValue val) {
	auto &sequence = *val.entry;
	WriteAheadLogSerializer serializer(*this, WALType::SEQUENCE_VALUE);
	serializer.WriteProperty(101, "schema", sequence.schema.name);
	serializer.WriteProperty(102, "name", sequence.name);
	serializer.WriteProperty(103, "usage_count", val.usage_count);
	serializer.WriteProperty(104, "counter", val.counter);
	serializer.End();
}